

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomNameVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::AtomNameVisitor::visitAtom(AtomNameVisitor *this,Atom *atom)

{
  ostream *poVar1;
  AtomType *this_00;
  string bn;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::GenericData> data;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb;
  iterator i;
  undefined1 auStack_a8 [64];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [16];
  _Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_50;
  undefined8 local_38;
  
  auStack_a8._32_8_ = (iterator *)0x0;
  auStack_a8._40_8_ = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_a8,"ATOMDATA",(allocator<char> *)&local_50);
  StuntDouble::getPropertyByName((StuntDouble *)local_60,(string *)atom);
  std::__cxx11::string::~string((string *)auStack_a8);
  if ((_func_int **)local_60._0_8_ == (_func_int **)0x0) {
    std::make_shared<OpenMD::AtomData>();
  }
  else {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>
              ((shared_ptr<OpenMD::GenericData> *)auStack_a8);
    std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)(auStack_a8 + 0x20),
               (__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_a8 + 8));
    if ((iterator *)auStack_a8._32_8_ != (iterator *)0x0) goto LAB_001e2ae9;
    poVar1 = std::operator<<((ostream *)&std::cerr,"can not get Atom Data from ");
    (*(atom->super_StuntDouble)._vptr_StuntDouble[7])(auStack_a8,atom);
    poVar1 = std::operator<<(poVar1,(string *)auStack_a8);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)auStack_a8);
    std::make_shared<OpenMD::AtomData>();
  }
  std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)(auStack_a8 + 0x20),
             (__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_a8 + 8));
LAB_001e2ae9:
  local_38._0_4_ = 0;
  local_38._4_4_ = 0;
  AtomData::beginAtomInfo((AtomData *)(auStack_a8 + 0x38),(iterator *)auStack_a8._32_8_);
  while ((string *)auStack_a8._56_8_ != (string *)0x0) {
    this_00 = ForceField::getAtomType(this->ff_,(string *)auStack_a8._56_8_);
    if (this_00 != (AtomType *)0x0) {
      AtomType::allYourBase
                ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)&local_50,
                 this_00);
      AtomType::getName_abi_cxx11_
                ((string *)auStack_a8,
                 (AtomType *)
                 ((SnapshotManager *)
                 ((long)local_50._M_impl.super__Vector_impl_data._M_finish + -0x28))->
                 previousSnapshot_);
      std::__cxx11::string::_M_assign((string *)auStack_a8._56_8_);
      std::__cxx11::string::~string((string *)auStack_a8);
      std::_Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~_Vector_base
                (&local_50);
    }
    AtomData::nextAtomInfo((AtomData *)auStack_a8,(iterator *)auStack_a8._32_8_);
    std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)(auStack_a8 + 0x38),
               (__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_a8 + 8));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_a8 + 0x28));
  return;
}

Assistant:

void AtomNameVisitor::visitAtom(Atom* atom) {
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<GenericData> data = atom->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);
      if (atomData == nullptr) {
        std::cerr << "can not get Atom Data from " << atom->getType()
                  << std::endl;
        atomData = std::make_shared<AtomData>();
      }
    } else {
      atomData = std::make_shared<AtomData>();
    }

    std::vector<std::shared_ptr<AtomInfo>>::iterator i;
    for (std::shared_ptr<AtomInfo> atomInfo = atomData->beginAtomInfo(i);
         atomInfo != nullptr; atomInfo      = atomData->nextAtomInfo(i)) {
      // query the force field for the AtomType associated with this
      // atomTypeName:
      AtomType* at = ff_->getAtomType(atomInfo->atomTypeName);
      // Sometimes the atomInfo is set to a fictitious type, so we'll
      // only do base replacement if this AtomType is known in the forceField:
      if (at != NULL) {
        // get the chain of base types for this atom type:
        std::vector<AtomType*> ayb = at->allYourBase();
        // use the last type in the chain of base types for the name:
        std::string bn = ayb[ayb.size() - 1]->getName();

        atomInfo->atomTypeName = bn;
      }
    }
  }